

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool __thiscall
testing::internal::TypedTestSuitePState::AddTestName
          (TypedTestSuitePState *this,char *file,int line,char *case_name,char *test_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FILE *__stream;
  allocator<char> local_81;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  char local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  char *local_60;
  CodeLocation local_58;
  
  __stream = _stderr;
  local_60 = test_name;
  if (this->registered_ != true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,file,&local_81);
    paVar1 = &local_58.file.field_2;
    if (local_80 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_70) {
      local_58.file.field_2._8_8_ = uStack_68;
      local_58.file._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_58.file._M_dataplus._M_p = (pointer)local_80;
    }
    local_58.file.field_2._M_allocated_capacity._1_7_ = uStack_6f;
    local_58.file.field_2._M_local_buf[0] = local_70;
    local_58.file._M_string_length = local_78;
    local_78 = 0;
    local_70 = '\0';
    local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&local_70;
    local_58.line = line;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
    ::_M_emplace_unique<char_const*&,testing::internal::CodeLocation>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
                *)&this->registered_tests_,&local_60,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.file._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_80 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&local_70) {
      operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
    }
    return true;
  }
  FormatFileLocation_abi_cxx11_
            (&local_58.file,(internal *)file,(char *)(ulong)(uint)line,(int)case_name);
  fprintf(__stream,"%s Test %s must be defined before REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
          local_58.file._M_dataplus._M_p,test_name,case_name);
  std::__cxx11::string::~string((string *)&local_58);
  fflush(_stderr);
  posix::Abort();
}

Assistant:

bool AddTestName(const char* file, int line, const char* case_name,
                   const char* test_name) {
    if (registered_) {
      fprintf(stderr,
              "%s Test %s must be defined before "
              "REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
              FormatFileLocation(file, line).c_str(), test_name, case_name);
      fflush(stderr);
      posix::Abort();
    }
    registered_tests_.emplace(test_name, CodeLocation(file, line));
    return true;
  }